

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O3

uint32_t FACTAudioEngine_SetVolume(FACTAudioEngine *pEngine,uint16_t nCategory,float volume)

{
  ushort uVar1;
  undefined6 in_register_00000032;
  long lVar2;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,nCategory) & 0xffffffff;
  FAudio_PlatformLockMutex(pEngine->apiLock);
  pEngine->categories[uVar3].currentVolume = volume * pEngine->categories[uVar3].volume;
  uVar1 = pEngine->categoryCount;
  if (uVar1 != 0) {
    lVar2 = 0x14;
    uVar3 = 0;
    do {
      if ((int)*(short *)((long)pEngine->categories + lVar2 + -0xc) == (uint)nCategory) {
        FACTAudioEngine_SetVolume
                  (pEngine,(uint16_t)uVar3,*(float *)(&pEngine->categories->instanceLimit + lVar2));
        uVar1 = pEngine->categoryCount;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while (uVar3 < uVar1);
  }
  FAudio_PlatformUnlockMutex(pEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTAudioEngine_SetVolume(
	FACTAudioEngine *pEngine,
	uint16_t nCategory,
	float volume
) {
	uint16_t i;
	FAudio_PlatformLockMutex(pEngine->apiLock);
	pEngine->categories[nCategory].currentVolume = (
		pEngine->categories[nCategory].volume *
		volume
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		if (pEngine->categories[i].parentCategory == nCategory)
		{
			FACTAudioEngine_SetVolume(
				pEngine,
				i,
				pEngine->categories[i].currentVolume
			);
		}
	}
	FAudio_PlatformUnlockMutex(pEngine->apiLock);
	return 0;
}